

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

void C_DrawConsole(bool hw2d)

{
  AActor *pAVar1;
  FBrokenLines **ppFVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  FFont *pFVar7;
  DFrameBuffer *pDVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  BYTE *pBVar16;
  char *pcVar17;
  size_t sVar18;
  long lVar19;
  player_t *ppVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  FBrokenLines **ppFVar24;
  FTexture *img;
  BYTE character;
  undefined8 uVar25;
  int iVar26;
  double dVar27;
  char tickstr [256];
  
  iVar22 = con_scale.Value;
  if (con_scale.Value == 0) {
    iVar22 = uiscale.Value;
  }
  if (iVar22 == 0) {
    iVar22 = CleanXfac;
  }
  iVar9 = ConFont->FontHeight;
  iVar14 = (ConBottom / iVar22 + iVar9 * -2) / iVar9;
  if (ConBottom / iVar22 - (iVar9 * 7) / 2 < (iVar14 + -1) * iVar9) {
    iVar9 = iVar9 / 2;
    iVar14 = iVar14 + -1;
  }
  if ((ConBottom < C_DrawConsole::oldbottom) &&
     ((((gamestate == GS_TITLELEVEL || (gamestate == GS_LEVEL)) &&
       (viewwindowy != 0 || viewwindowx != 0)) && (viewactive)))) {
    V_SetBorderNeedRefresh();
  }
  iVar10 = NotifyTop;
  bVar3 = con_centernotify.Value;
  iVar23 = ConBottom;
  C_DrawConsole::oldbottom = ConBottom;
  if (ConsoleState == c_up) {
    if (1 < (uint)(gamestate + GS_FORCEWIPEBURN)) {
      iVar22 = 1;
      if (con_scaletext.Value == 1 && uiscale.Value == 0) {
        iVar22 = CleanYfac;
      }
      iVar22 = iVar22 * SmallFont->FontHeight;
      BorderTopRefresh =
           (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x20])();
      bVar6 = true;
      lVar19 = 0;
      do {
        pDVar8 = screen;
        pFVar7 = SmallFont;
        iVar9 = *(int *)((long)&NotifyStrings[0].TimeOut + lVar19);
        if (iVar9 != 0) {
          iVar14 = iVar9 - gametic;
          if (iVar14 == 0 || iVar9 < gametic) {
            if (bVar6) {
              NotifyTop = NotifyTop + iVar22;
              iVar10 = iVar10 + iVar22;
            }
            *(undefined4 *)((long)&NotifyStrings[0].TimeOut + lVar19) = 0;
          }
          else if ((show_messages.Value != false) ||
                  (*(int *)((long)&NotifyStrings[0].PrintLevel + lVar19) == 0x80)) {
            dVar27 = (double)iVar14 / 6.0;
            if (5 < iVar14) {
              dVar27 = 1.0;
            }
            lVar15 = (long)*(int *)((long)&NotifyStrings[0].PrintLevel + lVar19);
            iVar9 = 0xb;
            if (lVar15 < 5) {
              iVar9 = PrintColors[lVar15];
            }
            if (con_scaletext.Value - 2U < 2) {
LAB_004766ce:
              if (bVar3 == false) {
                if (con_scaletext.Value == 3) {
                  iVar14 = 4;
                }
                else if (con_scaletext.Value == 2) {
                  iVar14 = 2;
                }
                else {
                  iVar14 = 1;
                  if (con_scaletext.Value == 1) {
                    iVar14 = uiscale.Value;
                  }
                }
                uVar4 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar14;
                if (con_scaletext.Value == 3) {
                  iVar14 = 4;
                }
                else if (con_scaletext.Value == 2) {
                  iVar14 = 2;
                }
                else {
                  iVar14 = 1;
                  if (con_scaletext.Value == 1) {
                    iVar14 = uiscale.Value;
                  }
                }
                pcVar17 = *(char **)((long)&NotifyStrings[0].Text.Chars + lVar19);
                uVar5 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Height / (long)iVar14;
                iVar14 = 0;
              }
              else {
                if (con_scaletext.Value == 3) {
                  iVar23 = 4;
                }
                else if (con_scaletext.Value == 2) {
                  iVar23 = 2;
                }
                else {
                  iVar23 = 1;
                  if (con_scaletext.Value == 1) {
                    iVar23 = uiscale.Value;
                  }
                }
                iVar26 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                iVar11 = FFont::StringWidth(SmallFont,
                                            *(BYTE **)((long)&NotifyStrings[0].Text.Chars + lVar19))
                ;
                if (con_scaletext.Value == 3) {
                  iVar14 = 4;
                }
                else if (con_scaletext.Value == 2) {
                  iVar14 = 2;
                }
                else {
                  iVar14 = 1;
                  if (con_scaletext.Value == 1) {
                    iVar14 = uiscale.Value;
                  }
                }
                iVar14 = (iVar26 / iVar23 - iVar11) / iVar14;
                pcVar17 = *(char **)((long)&NotifyStrings[0].Text.Chars + lVar19);
                if (con_scaletext.Value == 3) {
                  iVar23 = 4;
                }
                else if (con_scaletext.Value == 2) {
                  iVar23 = 2;
                }
                else {
                  iVar23 = 1;
                  if (con_scaletext.Value == 1) {
                    iVar23 = uiscale.Value;
                  }
                }
                uVar4 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar23;
                if (con_scaletext.Value == 3) {
                  iVar23 = 4;
                }
                else if (con_scaletext.Value == 2) {
                  iVar23 = 2;
                }
                else {
                  iVar23 = 1;
                  if (con_scaletext.Value == 1) {
                    iVar23 = uiscale.Value;
                  }
                }
                uVar5 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Height / (long)iVar23;
              }
              DCanvas::DrawText((DCanvas *)pDVar8,pFVar7,iVar9,iVar14,iVar10,pcVar17,0x40001399,
                                dVar27,uVar4 & 0xffffffff,0x4000139a,uVar5 & 0xffffffff,0x400013a8,1
                                ,0x4000138c,0);
            }
            else {
              if (con_scaletext.Value == 1) {
                if (uiscale.Value == 0) {
                  if (bVar3 == false) {
                    pcVar17 = *(char **)((long)&NotifyStrings[0].Text.Chars + lVar19);
                    iVar14 = 0;
                  }
                  else {
                    iVar14 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                    iVar23 = FFont::StringWidth(SmallFont,
                                                *(BYTE **)((long)&NotifyStrings[0].Text.Chars +
                                                          lVar19));
                    iVar14 = (iVar14 - iVar23 * CleanXfac) / 2;
                    pcVar17 = *(char **)((long)&NotifyStrings[0].Text.Chars + lVar19);
                  }
                  DCanvas::DrawText((DCanvas *)pDVar8,pFVar7,iVar9,iVar14,iVar10,pcVar17,0x40001393,
                                    dVar27,1,0x4000138c,0);
                  goto LAB_00476a1e;
                }
                if ((con_scaletext.Value - 2U < 2) || (uiscale.Value != 1)) goto LAB_004766ce;
              }
              if (bVar3 == false) {
                pcVar17 = *(char **)((long)&NotifyStrings[0].Text.Chars + lVar19);
                iVar14 = 0;
              }
              else {
                iVar14 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                iVar23 = FFont::StringWidth(SmallFont,
                                            *(BYTE **)((long)&NotifyStrings[0].Text.Chars + lVar19))
                ;
                iVar14 = (iVar14 - iVar23) / 2;
                pcVar17 = *(char **)((long)&NotifyStrings[0].Text.Chars + lVar19);
              }
              DCanvas::DrawText((DCanvas *)pDVar8,pFVar7,iVar9,iVar14,iVar10,pcVar17,0x4000138c,
                                dVar27,0);
            }
LAB_00476a1e:
            iVar10 = iVar10 + iVar22;
            bVar6 = false;
          }
        }
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x40);
      if (bVar6) {
        NotifyTop = 0;
      }
    }
  }
  else {
    if (ConBottom != 0) {
      if ((uint)conback.texnum < TexMan.Textures.Count) {
        img = TexMan.Textures.Array[conback.texnum].Texture;
      }
      else {
        img = (FTexture *)0x0;
      }
      uVar13 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
      uVar25 = 0xaf000000;
      if (conshade == '\0') {
        uVar25 = 0;
      }
      if (gamestate == GS_FULLCONSOLE) {
        dVar27 = 1.0;
      }
      else {
        dVar27 = (double)con_alpha.Value;
      }
      if (!hw2d) {
        dVar27 = 1.0;
      }
      DCanvas::DrawTexture
                ((DCanvas *)screen,img,0.0,(double)(int)(ConBottom - uVar13),0x40001389,dVar27,
                 (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,0x4000138a,
                 (ulong)uVar13,0x400013aa,uVar25,0x4000138c,0x400013a5,0,0);
      if ((conline == '\x01') && (iVar23 < (screen->super_DSimpleCanvas).super_DCanvas.Height)) {
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                  (screen,0,(ulong)(uint)iVar23,
                   (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
                   (ulong)(iVar23 + 1),0,0);
      }
      pDVar8 = screen;
      pFVar7 = ConFont;
      if (0xb < ConBottom) {
        iVar23 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
        if (iVar22 == 1) {
          pBVar16 = (BYTE *)GetVersionString();
          iVar10 = FFont::StringWidth(pFVar7,pBVar16);
          iVar26 = ConBottom - ConFont->FontHeight;
          pcVar17 = GetVersionString();
          DCanvas::DrawText((DCanvas *)pDVar8,pFVar7,8,(iVar23 - iVar10) + -8,iVar26 + -4,pcVar17,0)
          ;
        }
        else {
          pBVar16 = (BYTE *)GetVersionString();
          iVar26 = FFont::StringWidth(pFVar7,pBVar16);
          iVar11 = ConBottom / iVar22;
          iVar10 = ConFont->FontHeight;
          pcVar17 = GetVersionString();
          DCanvas::DrawText((DCanvas *)pDVar8,pFVar7,8,(iVar23 / iVar22 - iVar26) + -8,
                            (iVar11 - iVar10) + -4,pcVar17,0x40001399,
                            (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar22 &
                            0xffffffff,0x4000139a,
                            (long)(screen->super_DSimpleCanvas).super_DCanvas.Height / (long)iVar22
                            & 0xffffffff,0x400013a8,1,0);
        }
        pcVar17 = TickerLabel;
        if (TickerMax == 0) {
          TickerVisible = 0;
        }
        else {
          iVar26 = ConBottom / iVar22;
          iVar23 = ConFont->FontHeight;
          iVar10 = (screen->super_DSimpleCanvas).super_DCanvas.Width / iVar22;
          iVar10 = (int)((ulong)((long)iVar10 * 0x49f49f49) >> 0x20) - iVar10;
          iVar10 = ConCols / iVar22 + ((iVar10 >> 6) - (iVar10 >> 0x1f)) + -6;
          if (TickerLabel == (char *)0x0) {
            iVar11 = 0;
          }
          else {
            sVar18 = strlen(TickerLabel);
            iVar11 = (int)sVar18 + 2;
            mysnprintf(tickstr,0x100,"%s: ",pcVar17);
          }
          iVar12 = (*ConFont->_vptr_FFont[3])(ConFont,0x12);
          if (0x100 - iVar12 < iVar10) {
            iVar10 = (*ConFont->_vptr_FFont[3])(ConFont,0x12);
            iVar10 = 0x100 - iVar10;
          }
          tickstr[iVar11] = '\x10';
          memset(tickstr + (long)iVar11 + 1,0x11,(long)(iVar10 - iVar11));
          lVar19 = (long)iVar10;
          (tickstr + lVar19 + 1)[0] = '\x12';
          (tickstr + lVar19 + 1)[1] = ' ';
          if (TickerPercent == true) {
            mysnprintf(tickstr + lVar19 + 3,0xfd - lVar19,"%d%%",
                       ((long)(int)TickerAt * 100) / (long)(int)TickerMax & 0xffffffff);
          }
          else {
            tickstr[lVar19 + 3] = '\0';
          }
          iVar23 = (iVar26 - iVar23) + -4;
          if (iVar22 == 1) {
            DCanvas::DrawText((DCanvas *)screen,ConFont,4,8,iVar23,tickstr,0);
          }
          else {
            DCanvas::DrawText((DCanvas *)screen,ConFont,4,8,iVar23,tickstr,0x40001399,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar22
                              & 0xffffffff,0x4000139a,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                              (long)iVar22 & 0xffffffff,0x400013a8,1,0);
          }
          iVar10 = (int)(((long)((iVar10 - iVar11) * 8) * (long)(int)TickerAt) /
                        (long)(int)TickerMax) + iVar11 * 8 + 0xd;
          if (iVar22 == 1) {
            DCanvas::DrawChar((DCanvas *)screen,ConFont,8,iVar10,iVar23,'\x13',0);
          }
          else {
            DCanvas::DrawChar((DCanvas *)screen,ConFont,8,iVar10,iVar23,'\x13',0x40001399,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar22
                              & 0xffffffff,0x4000139a,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                              (long)iVar22 & 0xffffffff,0x400013a8,1,0);
          }
          TickerVisible = 1;
        }
      }
      if (StatusBar != (DBaseStatusBar *)0x0 && !hw2d) {
        ppVar20 = StatusBar->CPlayer;
        pAVar1 = (ppVar20->camera).field_0.p;
        if (pAVar1 != (AActor *)0x0) {
          if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            if (((ppVar20->camera).field_0.p)->player != (player_t *)0x0) {
              ppVar20 = ((ppVar20->camera).field_0.p)->player;
            }
          }
          else {
            (ppVar20->camera).field_0.p = (AActor *)0x0;
          }
        }
        if (((ppVar20->BlendA != 0.0) || (NAN(ppVar20->BlendA))) &&
           ((gamestate == GS_TITLELEVEL || (gamestate == GS_LEVEL)))) {
          (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                    (screen,(ulong)((int)(ppVar20->BlendB * 255.0) & 0xffU |
                                   ((int)(ppVar20->BlendG * 255.0) & 0xffU) << 8 |
                                   ((int)(ppVar20->BlendR * 255.0) & 0xffU) << 0x10),0,
                     (ulong)(uint)ConBottom,
                     (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
                     (ulong)(uint)((screen->super_DSimpleCanvas).super_DCanvas.Height - ConBottom));
          ST_SetNeedRefresh();
          V_SetBorderNeedRefresh();
        }
      }
    }
    if ((menuactive == MENU_Off) && (0 < iVar14)) {
      FConsoleBuffer::FormatText(conbuffer,ConFont,ConWidth / iVar22);
      ppFVar2 = (conbuffer->mBrokenLines).Array;
      iVar10 = ConBottom / iVar22;
      iVar23 = ConFont->FontHeight;
      ConsoleDrawing = 1;
      if (ppFVar2 <= ppFVar2 + (ulong)(uint)conbuffer->mTextLines + (-1 - (long)RowAdjust)) {
        ppFVar24 = ppFVar2 + (((ulong)(uint)conbuffer->mTextLines - 2) - (long)RowAdjust);
        do {
          iVar26 = ConFont->FontHeight * iVar14 - iVar9;
          pcVar17 = (ppFVar24[1]->Text).Chars;
          if (iVar22 == 1) {
            DCanvas::DrawText((DCanvas *)screen,ConFont,1,8,iVar26,pcVar17,0);
          }
          else {
            DCanvas::DrawText((DCanvas *)screen,ConFont,1,8,iVar26,pcVar17,0x40001399,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar22
                              & 0xffffffff,0x4000139a,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                              (long)iVar22 & 0xffffffff,0x400013a8,1,0);
          }
          if (ppFVar24 < ppFVar2) break;
          ppFVar24 = ppFVar24 + -1;
          bVar3 = 1 < iVar14;
          iVar14 = iVar14 + -1;
        } while (bVar3);
      }
      ConsoleDrawing = 0;
      if (0x13 < ConBottom) {
        iVar9 = iVar10 + iVar23 * -2 + -4;
        if (gamestate != GS_STARTUP) {
          CmdLine[(ulong)CmdLine[0] + 2] = '\0';
          FString::FString((FString *)tickstr,(char *)(CmdLine + (ulong)CmdLine[0x103] + 2));
          uVar21 = (uint)CmdLine[1];
          uVar13 = (uint)CmdLine[0x103];
          if (iVar22 == 1) {
            DCanvas::DrawChar((DCanvas *)screen,ConFont,8,8,iVar9,'\x1c',0);
            pDVar8 = screen;
            pFVar7 = ConFont;
            iVar14 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
            DCanvas::DrawText((DCanvas *)pDVar8,pFVar7,8,iVar14 + 8,iVar9,(char *)tickstr._0_8_,0);
            pDVar8 = screen;
            pFVar7 = ConFont;
            if (cursoron == true) {
              iVar14 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
              iVar23 = (*ConFont->_vptr_FFont[3])(ConFont,0xb);
              DCanvas::DrawChar((DCanvas *)pDVar8,pFVar7,10,iVar14 + iVar23 * (uVar21 - uVar13) + 8,
                                iVar9,'\v',0);
            }
          }
          else {
            DCanvas::DrawChar((DCanvas *)screen,ConFont,8,8,iVar9,'\x1c',0x40001399,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar22
                              & 0xffffffff,0x4000139a,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                              (long)iVar22 & 0xffffffff,0x400013a8,1,0);
            pDVar8 = screen;
            pFVar7 = ConFont;
            iVar14 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
            DCanvas::DrawText((DCanvas *)pDVar8,pFVar7,8,iVar14 + 8,iVar9,(char *)tickstr._0_8_,
                              0x40001399,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar22
                              & 0xffffffff,0x4000139a,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                              (long)iVar22 & 0xffffffff,0x400013a8,1,0);
            pDVar8 = screen;
            pFVar7 = ConFont;
            if (cursoron == true) {
              iVar14 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
              iVar23 = (*ConFont->_vptr_FFont[3])(ConFont,0xb);
              DCanvas::DrawChar((DCanvas *)pDVar8,pFVar7,10,iVar14 + iVar23 * (uVar21 - uVar13) + 8,
                                iVar9,'\v',0x40001399,
                                (long)(screen->super_DSimpleCanvas).super_DCanvas.Width /
                                (long)iVar22 & 0xffffffff,0x4000139a,
                                (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                                (long)iVar22 & 0xffffffff,0x400013a8,1,0);
            }
          }
          FString::~FString((FString *)tickstr);
        }
        if ((RowAdjust != 0) && ((ConFont->FontHeight * 7) / 2 <= ConBottom)) {
          character = (RowAdjust == conbuffer->mTextLines) * '\x02' + '\n';
          if (iVar22 == 1) {
            DCanvas::DrawChar((DCanvas *)screen,ConFont,3,0,iVar9,character,0);
          }
          else {
            DCanvas::DrawChar((DCanvas *)screen,ConFont,3,0,iVar9,character,0x40001399,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar22
                              & 0xffffffff,0x4000139a,
                              (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                              (long)iVar22 & 0xffffffff,0x400013a8,1,0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void C_DrawConsole (bool hw2d)
{
	static int oldbottom = 0;
	int lines, left, offset;

	int textScale = active_con_scale();
	if (textScale == 0)
		textScale = CleanXfac;

	left = LEFTMARGIN;
	lines = (ConBottom/textScale-ConFont->GetHeight()*2)/ConFont->GetHeight();
	if (-ConFont->GetHeight() + lines*ConFont->GetHeight() > ConBottom/textScale - ConFont->GetHeight()*7/2)
	{
		offset = -ConFont->GetHeight()/2;
		lines--;
	}
	else
	{
		offset = -ConFont->GetHeight();
	}

	if ((ConBottom < oldbottom) &&
		(gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL) &&
		(viewwindowx || viewwindowy) &&
		viewactive)
	{
		V_SetBorderNeedRefresh();
	}

	oldbottom = ConBottom;

	if (ConsoleState == c_up)
	{
		C_DrawNotifyText ();
		return;
	}
	else if (ConBottom)
	{
		int visheight;
		FTexture *conpic = TexMan[conback];

		visheight = ConBottom;

		screen->DrawTexture (conpic, 0, visheight - screen->GetHeight(),
			DTA_DestWidth, screen->GetWidth(),
			DTA_DestHeight, screen->GetHeight(),
			DTA_ColorOverlay, conshade,
			DTA_AlphaF, (hw2d && gamestate != GS_FULLCONSOLE) ? (double)con_alpha : 1.,
			DTA_Masked, false,
			TAG_DONE);
		if (conline && visheight < screen->GetHeight())
		{
			screen->Clear (0, visheight, screen->GetWidth(), visheight+1, 0, 0);
		}

		if (ConBottom >= 12)
		{
			if (textScale == 1)
				screen->DrawText (ConFont, CR_ORANGE, SCREENWIDTH - 8 -
					ConFont->StringWidth (GetVersionString()),
					ConBottom / textScale - ConFont->GetHeight() - 4,
					GetVersionString(), TAG_DONE);
			else
				screen->DrawText(ConFont, CR_ORANGE, SCREENWIDTH / textScale - 8 -
					ConFont->StringWidth(GetVersionString()),
					ConBottom / textScale - ConFont->GetHeight() - 4,
					GetVersionString(),
					DTA_VirtualWidth, screen->GetWidth() / textScale,
					DTA_VirtualHeight, screen->GetHeight() / textScale,
					DTA_KeepRatio, true, TAG_DONE);

			if (TickerMax)
			{
				char tickstr[256];
				const int tickerY = ConBottom / textScale - ConFont->GetHeight() - 4;
				size_t i;
				int tickend = ConCols / textScale - SCREENWIDTH / textScale / 90 - 6;
				int tickbegin = 0;

				if (TickerLabel)
				{
					tickbegin = (int)strlen (TickerLabel) + 2;
					mysnprintf (tickstr, countof(tickstr), "%s: ", TickerLabel);
				}
				if (tickend > 256 - ConFont->GetCharWidth(0x12))
					tickend = 256 - ConFont->GetCharWidth(0x12);
				tickstr[tickbegin] = 0x10;
				memset (tickstr + tickbegin + 1, 0x11, tickend - tickbegin);
				tickstr[tickend + 1] = 0x12;
				tickstr[tickend + 2] = ' ';
				if (TickerPercent)
				{
					mysnprintf (tickstr + tickend + 3, countof(tickstr) - tickend - 3,
						"%d%%", Scale (TickerAt, 100, TickerMax));
				}
				else
				{
					tickstr[tickend+3] = 0;
				}
				if (textScale == 1)
					screen->DrawText (ConFont, CR_BROWN, LEFTMARGIN, tickerY, tickstr, TAG_DONE);
				else
					screen->DrawText (ConFont, CR_BROWN, LEFTMARGIN, tickerY, tickstr,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);

				// Draw the marker
				i = LEFTMARGIN+5+tickbegin*8 + Scale (TickerAt, (SDWORD)(tickend - tickbegin)*8, TickerMax);
				if (textScale == 1)
					screen->DrawChar (ConFont, CR_ORANGE, (int)i, tickerY, 0x13, TAG_DONE);
				else
					screen->DrawChar(ConFont, CR_ORANGE, (int)i, tickerY, 0x13,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);

				TickerVisible = true;
			}
			else
			{
				TickerVisible = false;
			}
		}

		// Apply palette blend effects
		if (StatusBar != NULL && !hw2d)
		{
			player_t *player = StatusBar->CPlayer;
			if (player->camera != NULL && player->camera->player != NULL)
			{
				player = player->camera->player;
			}
			if (player->BlendA != 0 && (gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL))
			{
				screen->Dim (PalEntry ((unsigned char)(player->BlendR*255), (unsigned char)(player->BlendG*255), (unsigned char)(player->BlendB*255)),
					player->BlendA, 0, ConBottom, screen->GetWidth(), screen->GetHeight() - ConBottom);
				ST_SetNeedRefresh();
				V_SetBorderNeedRefresh();
			}
		}
	}

	if (menuactive != MENU_Off)
	{
		return;
	}

	if (lines > 0)
	{
		// No more enqueuing because adding new text to the console won't touch the actual print data.
		conbuffer->FormatText(ConFont, ConWidth / textScale);
		unsigned int consolelines = conbuffer->GetFormattedLineCount();
		FBrokenLines **blines = conbuffer->GetLines();
		FBrokenLines **printline = blines + consolelines - 1 - RowAdjust;

		int bottomline = ConBottom / textScale - ConFont->GetHeight()*2 - 4;

		ConsoleDrawing = true;

		for(FBrokenLines **p = printline; p >= blines && lines > 0; p--, lines--)
		{
			if (textScale == 1)
			{
				screen->DrawText(ConFont, CR_TAN, LEFTMARGIN, offset + lines * ConFont->GetHeight(), (*p)->Text, TAG_DONE);
			}
			else
			{
				screen->DrawText(ConFont, CR_TAN, LEFTMARGIN, offset + lines * ConFont->GetHeight(), (*p)->Text,
					DTA_VirtualWidth, screen->GetWidth() / textScale,
					DTA_VirtualHeight, screen->GetHeight() / textScale,
					DTA_KeepRatio, true, TAG_DONE);
			}
		}

		ConsoleDrawing = false;

		if (ConBottom >= 20)
		{
			if (gamestate != GS_STARTUP)
			{
				// Make a copy of the command line, in case an input event is handled
				// while we draw the console and it changes.
				CmdLine[2+CmdLine[0]] = 0;
				FString command((char *)&CmdLine[2+CmdLine[259]]);
				int cursorpos = CmdLine[1] - CmdLine[259];

				if (textScale == 1)
				{
					screen->DrawChar(ConFont, CR_ORANGE, left, bottomline, '\x1c', TAG_DONE);
					screen->DrawText(ConFont, CR_ORANGE, left + ConFont->GetCharWidth(0x1c), bottomline,
						command, TAG_DONE);

					if (cursoron)
					{
						screen->DrawChar(ConFont, CR_YELLOW, left + ConFont->GetCharWidth(0x1c) + cursorpos * ConFont->GetCharWidth(0xb),
							bottomline, '\xb', TAG_DONE);
					}
				}
				else
				{
					screen->DrawChar(ConFont, CR_ORANGE, left, bottomline, '\x1c',
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);

					screen->DrawText(ConFont, CR_ORANGE, left + ConFont->GetCharWidth(0x1c), bottomline,
						command,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);

					if (cursoron)
					{
						screen->DrawChar(ConFont, CR_YELLOW, left + ConFont->GetCharWidth(0x1c) + cursorpos * ConFont->GetCharWidth(0xb),
							bottomline, '\xb',
							DTA_VirtualWidth, screen->GetWidth() / textScale,
							DTA_VirtualHeight, screen->GetHeight() / textScale,
							DTA_KeepRatio, true, TAG_DONE);
					}
				}
			}
			if (RowAdjust && ConBottom >= ConFont->GetHeight()*7/2)
			{
				// Indicate that the view has been scrolled up (10)
				// and if we can scroll no further (12)
				if (textScale == 1)
					screen->DrawChar (ConFont, CR_GREEN, 0, bottomline, RowAdjust == conbuffer->GetFormattedLineCount() ? 12 : 10, TAG_DONE);
				else
					screen->DrawChar(ConFont, CR_GREEN, 0, bottomline, RowAdjust == conbuffer->GetFormattedLineCount() ? 12 : 10,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);
			}
		}
	}
}